

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentLowering.cpp
# Opt level: O0

Expression * __thiscall wasm::AlignmentLowering::lowerStoreI32(AlignmentLowering *this,Store *curr)

{
  Block *this_00;
  Index IVar1;
  bool bVar2;
  address64_t aVar3;
  Module *pMVar4;
  Memory *pMVar5;
  Function *pFVar6;
  ExpressionList *pEVar7;
  LocalGet *pLVar8;
  LocalGet *pLVar9;
  Store *pSVar10;
  Const *pCVar11;
  Binary *pBVar12;
  optional<wasm::Type> type_;
  optional<wasm::Type> type;
  optional<wasm::Type> local_240;
  pointer local_230;
  pointer local_228;
  Type local_220;
  Type local_218;
  uintptr_t local_210;
  Address local_208;
  pointer local_200;
  pointer local_1f8;
  Type local_1f0;
  Type local_1e8;
  uintptr_t local_1e0;
  Address local_1d8;
  pointer local_1d0;
  pointer local_1c8;
  Type local_1c0;
  Type local_1b8;
  uintptr_t local_1b0;
  Address local_1a8;
  pointer local_1a0;
  pointer local_198;
  Type local_190;
  Type local_188;
  uintptr_t local_180;
  Address local_178;
  pointer local_170;
  pointer local_168;
  Type local_160;
  Type local_158;
  uintptr_t local_150;
  Address local_148;
  pointer local_140;
  pointer local_138;
  Type local_130;
  Type local_128;
  uintptr_t local_120;
  Address local_118;
  pointer local_110;
  pointer local_108;
  Type local_100;
  Type local_f8;
  uintptr_t local_f0;
  Address local_e8;
  pointer local_e0;
  pointer local_d8;
  Type local_d0;
  Type local_c8;
  uintptr_t local_c0;
  Address local_b8;
  optional<wasm::Type> local_a8;
  LocalSet *local_98;
  LocalSet *local_90;
  initializer_list<wasm::Expression_*> local_88;
  Block *local_78;
  Block *block;
  Index local_64;
  uintptr_t uStack_60;
  Index tempValue;
  Index local_54;
  Type TStack_50;
  Index tempPtr;
  Type addressType;
  Memory *mem;
  Builder local_28;
  Builder builder;
  Store *curr_local;
  AlignmentLowering *this_local;
  
  builder.wasm = (Module *)curr;
  aVar3 = wasm::Address::operator_cast_to_unsigned_long(&curr->align);
  if ((aVar3 == 0) ||
     (aVar3 = wasm::Address::operator_cast_to_unsigned_long
                        ((Address *)
                         &((builder.wasm)->functions).
                          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish),
     aVar3 == *(byte *)&((builder.wasm)->exports).
                        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)) {
    this_local = (AlignmentLowering *)builder.wasm;
  }
  else {
    pMVar4 = Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                        ).
                        super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                        .
                        super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                      );
    Builder::Builder(&local_28,pMVar4);
    mem._4_4_ = 2;
    bVar2 = wasm::Type::operator==
                      ((Type *)(((builder.wasm)->globals).
                                super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 1),
                       (BasicType *)((long)&mem + 4));
    if (!bVar2) {
      __assert_fail("curr->value->type == Type::i32",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/AlignmentLowering.cpp"
                    ,0x92,"Expression *wasm::AlignmentLowering::lowerStoreI32(Store *)");
    }
    pMVar4 = Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                        ).
                        super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                        .
                        super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                      );
    addressType.id =
         (uintptr_t)
         ((builder.wasm)->tags).
         super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pMVar5 = Module::getMemory(pMVar4,(IString)*(IString *)
                                                &((builder.wasm)->tags).
                                                 super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                                 ._M_impl.super__Vector_impl_data);
    TStack_50.id = (pMVar5->addressType).id;
    pFVar6 = Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::
             getFunction(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                          ).
                          super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                          .
                          super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                        );
    uStack_60 = TStack_50.id;
    local_54 = Builder::addVar(pFVar6,TStack_50);
    pFVar6 = Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::
             getFunction(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                          ).
                          super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                          .
                          super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                        );
    wasm::Type::Type((Type *)&block,i32);
    local_64 = Builder::addVar(pFVar6,(Type)block);
    local_98 = Builder::makeLocalSet
                         (&local_28,local_54,
                          (Expression *)
                          ((builder.wasm)->globals).
                          super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    local_90 = Builder::makeLocalSet
                         (&local_28,local_64,
                          (Expression *)
                          ((builder.wasm)->globals).
                          super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
    local_88._M_array = (iterator)&local_98;
    local_88._M_len = 2;
    std::optional<wasm::Type>::optional(&local_a8);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         local_a8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_payload;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged =
         local_a8.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_engaged;
    local_78 = Builder::makeBlock(&local_28,&local_88,type);
    if (*(char *)&((builder.wasm)->exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage == '\x02') {
      pEVar7 = &local_78->list;
      local_b8.addr =
           (address64_t)
           ((builder.wasm)->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_c0 = TStack_50.id;
      pLVar8 = Builder::makeLocalGet(&local_28,local_54,TStack_50);
      IVar1 = local_64;
      wasm::Type::Type(&local_c8,i32);
      pLVar9 = Builder::makeLocalGet(&local_28,IVar1,local_c8);
      wasm::Type::Type(&local_d0,i32);
      local_e0 = ((builder.wasm)->tags).
                 super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_d8 = ((builder.wasm)->tags).
                 super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      pSVar10 = Builder::makeStore(&local_28,1,local_b8,1,(Expression *)pLVar8,(Expression *)pLVar9,
                                   local_d0,(IString)*(IString *)
                                                      &((builder.wasm)->tags).
                                                                                                              
                                                  super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                                  ._M_impl.super__Vector_impl_data);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&pEVar7->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                 ,(Expression *)pSVar10);
      pEVar7 = &local_78->list;
      aVar3 = wasm::Address::operator_cast_to_unsigned_long((Address *)&(builder.wasm)->functions);
      wasm::Address::Address(&local_e8,aVar3 + 1);
      local_f0 = TStack_50.id;
      pLVar8 = Builder::makeLocalGet(&local_28,local_54,TStack_50);
      IVar1 = local_64;
      wasm::Type::Type(&local_f8,i32);
      pLVar9 = Builder::makeLocalGet(&local_28,IVar1,local_f8);
      pCVar11 = Builder::makeConst<int>(&local_28,8);
      pBVar12 = Builder::makeBinary(&local_28,ShrUInt32,(Expression *)pLVar9,(Expression *)pCVar11);
      wasm::Type::Type(&local_100,i32);
      local_110 = ((builder.wasm)->tags).
                  super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_108 = ((builder.wasm)->tags).
                  super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      pSVar10 = Builder::makeStore(&local_28,1,local_e8,1,(Expression *)pLVar8,(Expression *)pBVar12
                                   ,local_100,
                                   (IString)*(IString *)
                                             &((builder.wasm)->tags).
                                              super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                              ._M_impl.super__Vector_impl_data);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&pEVar7->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                 ,(Expression *)pSVar10);
    }
    else {
      if (*(char *)&((builder.wasm)->exports).
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage != '\x04') {
        handle_unreachable("invalid size",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/AlignmentLowering.cpp"
                           ,0xec);
      }
      aVar3 = wasm::Address::operator_cast_to_unsigned_long
                        ((Address *)
                         &((builder.wasm)->functions).
                          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      if (aVar3 == 1) {
        pEVar7 = &local_78->list;
        local_118.addr =
             (address64_t)
             ((builder.wasm)->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_120 = TStack_50.id;
        pLVar8 = Builder::makeLocalGet(&local_28,local_54,TStack_50);
        IVar1 = local_64;
        wasm::Type::Type(&local_128,i32);
        pLVar9 = Builder::makeLocalGet(&local_28,IVar1,local_128);
        wasm::Type::Type(&local_130,i32);
        local_140 = ((builder.wasm)->tags).
                    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_138 = ((builder.wasm)->tags).
                    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        pSVar10 = Builder::makeStore(&local_28,1,local_118,1,(Expression *)pLVar8,
                                     (Expression *)pLVar9,local_130,
                                     (IString)*(IString *)
                                               &((builder.wasm)->tags).
                                                super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                                ._M_impl.super__Vector_impl_data);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar7->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pSVar10);
        pEVar7 = &local_78->list;
        aVar3 = wasm::Address::operator_cast_to_unsigned_long((Address *)&(builder.wasm)->functions)
        ;
        wasm::Address::Address(&local_148,aVar3 + 1);
        local_150 = TStack_50.id;
        pLVar8 = Builder::makeLocalGet(&local_28,local_54,TStack_50);
        IVar1 = local_64;
        wasm::Type::Type(&local_158,i32);
        pLVar9 = Builder::makeLocalGet(&local_28,IVar1,local_158);
        pCVar11 = Builder::makeConst<int>(&local_28,8);
        pBVar12 = Builder::makeBinary(&local_28,ShrUInt32,(Expression *)pLVar9,(Expression *)pCVar11
                                     );
        wasm::Type::Type(&local_160,i32);
        local_170 = ((builder.wasm)->tags).
                    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_168 = ((builder.wasm)->tags).
                    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        pSVar10 = Builder::makeStore(&local_28,1,local_148,1,(Expression *)pLVar8,
                                     (Expression *)pBVar12,local_160,
                                     (IString)*(IString *)
                                               &((builder.wasm)->tags).
                                                super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                                ._M_impl.super__Vector_impl_data);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar7->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pSVar10);
        pEVar7 = &local_78->list;
        aVar3 = wasm::Address::operator_cast_to_unsigned_long((Address *)&(builder.wasm)->functions)
        ;
        wasm::Address::Address(&local_178,aVar3 + 2);
        local_180 = TStack_50.id;
        pLVar8 = Builder::makeLocalGet(&local_28,local_54,TStack_50);
        IVar1 = local_64;
        wasm::Type::Type(&local_188,i32);
        pLVar9 = Builder::makeLocalGet(&local_28,IVar1,local_188);
        pCVar11 = Builder::makeConst<int>(&local_28,0x10);
        pBVar12 = Builder::makeBinary(&local_28,ShrUInt32,(Expression *)pLVar9,(Expression *)pCVar11
                                     );
        wasm::Type::Type(&local_190,i32);
        local_1a0 = ((builder.wasm)->tags).
                    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_198 = ((builder.wasm)->tags).
                    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        pSVar10 = Builder::makeStore(&local_28,1,local_178,1,(Expression *)pLVar8,
                                     (Expression *)pBVar12,local_190,
                                     (IString)*(IString *)
                                               &((builder.wasm)->tags).
                                                super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                                ._M_impl.super__Vector_impl_data);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar7->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pSVar10);
        pEVar7 = &local_78->list;
        aVar3 = wasm::Address::operator_cast_to_unsigned_long((Address *)&(builder.wasm)->functions)
        ;
        wasm::Address::Address(&local_1a8,aVar3 + 3);
        local_1b0 = TStack_50.id;
        pLVar8 = Builder::makeLocalGet(&local_28,local_54,TStack_50);
        IVar1 = local_64;
        wasm::Type::Type(&local_1b8,i32);
        pLVar9 = Builder::makeLocalGet(&local_28,IVar1,local_1b8);
        pCVar11 = Builder::makeConst<int>(&local_28,0x18);
        pBVar12 = Builder::makeBinary(&local_28,ShrUInt32,(Expression *)pLVar9,(Expression *)pCVar11
                                     );
        wasm::Type::Type(&local_1c0,i32);
        local_1d0 = ((builder.wasm)->tags).
                    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_1c8 = ((builder.wasm)->tags).
                    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        pSVar10 = Builder::makeStore(&local_28,1,local_1a8,1,(Expression *)pLVar8,
                                     (Expression *)pBVar12,local_1c0,
                                     (IString)*(IString *)
                                               &((builder.wasm)->tags).
                                                super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                                ._M_impl.super__Vector_impl_data);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar7->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pSVar10);
      }
      else {
        aVar3 = wasm::Address::operator_cast_to_unsigned_long
                          ((Address *)
                           &((builder.wasm)->functions).
                            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
        if (aVar3 != 2) {
          handle_unreachable("invalid alignment",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/AlignmentLowering.cpp"
                             ,0xe9);
        }
        pEVar7 = &local_78->list;
        local_1d8.addr =
             (address64_t)
             ((builder.wasm)->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1e0 = TStack_50.id;
        pLVar8 = Builder::makeLocalGet(&local_28,local_54,TStack_50);
        IVar1 = local_64;
        wasm::Type::Type(&local_1e8,i32);
        pLVar9 = Builder::makeLocalGet(&local_28,IVar1,local_1e8);
        wasm::Type::Type(&local_1f0,i32);
        local_200 = ((builder.wasm)->tags).
                    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_1f8 = ((builder.wasm)->tags).
                    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        pSVar10 = Builder::makeStore(&local_28,2,local_1d8,2,(Expression *)pLVar8,
                                     (Expression *)pLVar9,local_1f0,
                                     (IString)*(IString *)
                                               &((builder.wasm)->tags).
                                                super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                                ._M_impl.super__Vector_impl_data);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar7->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pSVar10);
        pEVar7 = &local_78->list;
        aVar3 = wasm::Address::operator_cast_to_unsigned_long((Address *)&(builder.wasm)->functions)
        ;
        wasm::Address::Address(&local_208,aVar3 + 2);
        local_210 = TStack_50.id;
        pLVar8 = Builder::makeLocalGet(&local_28,local_54,TStack_50);
        IVar1 = local_64;
        wasm::Type::Type(&local_218,i32);
        pLVar9 = Builder::makeLocalGet(&local_28,IVar1,local_218);
        pCVar11 = Builder::makeConst<int>(&local_28,0x10);
        pBVar12 = Builder::makeBinary(&local_28,ShrUInt32,(Expression *)pLVar9,(Expression *)pCVar11
                                     );
        wasm::Type::Type(&local_220,i32);
        local_230 = ((builder.wasm)->tags).
                    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_228 = ((builder.wasm)->tags).
                    super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        pSVar10 = Builder::makeStore(&local_28,2,local_208,2,(Expression *)pLVar8,
                                     (Expression *)pBVar12,local_220,
                                     (IString)*(IString *)
                                               &((builder.wasm)->tags).
                                                super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                                                ._M_impl.super__Vector_impl_data);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar7->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pSVar10);
      }
    }
    this_00 = local_78;
    std::optional<wasm::Type>::optional(&local_240);
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         local_240.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_payload;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged =
         local_240.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_engaged;
    Block::finalize(this_00,type_,Unknown);
    this_local = (AlignmentLowering *)local_78;
  }
  return (Expression *)this_local;
}

Assistant:

Expression* lowerStoreI32(Store* curr) {
    if (curr->align == 0 || curr->align == curr->bytes) {
      return curr;
    }
    Builder builder(*getModule());
    assert(curr->value->type == Type::i32);
    auto mem = getModule()->getMemory(curr->memory);
    auto addressType = mem->addressType;
    auto tempPtr = builder.addVar(getFunction(), addressType);
    auto tempValue = builder.addVar(getFunction(), Type::i32);
    auto* block =
      builder.makeBlock({builder.makeLocalSet(tempPtr, curr->ptr),
                         builder.makeLocalSet(tempValue, curr->value)});
    if (curr->bytes == 2) {
      block->list.push_back(
        builder.makeStore(1,
                          curr->offset,
                          1,
                          builder.makeLocalGet(tempPtr, addressType),
                          builder.makeLocalGet(tempValue, Type::i32),
                          Type::i32,
                          curr->memory));
      block->list.push_back(builder.makeStore(
        1,
        curr->offset + 1,
        1,
        builder.makeLocalGet(tempPtr, addressType),
        builder.makeBinary(ShrUInt32,
                           builder.makeLocalGet(tempValue, Type::i32),
                           builder.makeConst(int32_t(8))),
        Type::i32,
        curr->memory));
    } else if (curr->bytes == 4) {
      if (curr->align == 1) {
        block->list.push_back(
          builder.makeStore(1,
                            curr->offset,
                            1,
                            builder.makeLocalGet(tempPtr, addressType),
                            builder.makeLocalGet(tempValue, Type::i32),
                            Type::i32,
                            curr->memory));
        block->list.push_back(builder.makeStore(
          1,
          curr->offset + 1,
          1,
          builder.makeLocalGet(tempPtr, addressType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(8))),
          Type::i32,
          curr->memory));
        block->list.push_back(builder.makeStore(
          1,
          curr->offset + 2,
          1,
          builder.makeLocalGet(tempPtr, addressType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(16))),
          Type::i32,
          curr->memory));
        block->list.push_back(builder.makeStore(
          1,
          curr->offset + 3,
          1,
          builder.makeLocalGet(tempPtr, addressType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(24))),
          Type::i32,
          curr->memory));
      } else if (curr->align == 2) {
        block->list.push_back(
          builder.makeStore(2,
                            curr->offset,
                            2,
                            builder.makeLocalGet(tempPtr, addressType),
                            builder.makeLocalGet(tempValue, Type::i32),
                            Type::i32,
                            curr->memory));
        block->list.push_back(builder.makeStore(
          2,
          curr->offset + 2,
          2,
          builder.makeLocalGet(tempPtr, addressType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(16))),
          Type::i32,
          curr->memory));
      } else {
        WASM_UNREACHABLE("invalid alignment");
      }
    } else {
      WASM_UNREACHABLE("invalid size");
    }
    block->finalize();
    return block;
  }